

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

bool Assimp::PLY::PropertyInstance::ParseValueBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,EDataType eType,ValueUnion *out,bool p_bBE)

{
  ushort uVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __last;
  pointer pcVar2;
  pointer pcVar3;
  ValueUnion VVar4;
  ushort uVar5;
  bool bVar6;
  uint uVar7;
  byte *pbVar8;
  runtime_error *this;
  uint uVar9;
  uint uVar10;
  ValueUnion VVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  vector<char,_std::allocator<char>_> nbuffer;
  allocator_type local_71;
  uint *local_70;
  pointer *local_68;
  pointer pcStack_60;
  pointer local_58 [2];
  vector<char,_std::allocator<char>_> local_48;
  
  if (out == (ValueUnion *)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x3e0,
                  "static bool Assimp::PLY::PropertyInstance::ParseValueBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, PLY::EDataType, PLY::PropertyInstance::ValueUnion *, bool)"
                 );
  }
  uVar15 = 0;
  if ((eType < EDT_INVALID) &&
     (uVar15 = *(uint *)(&DAT_006ce7f0 + (ulong)eType * 4), *bufferSize < uVar15)) {
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_70 = bufferSize;
    bVar6 = IOStreamBuffer<char>::getNextBlock(streamBuffer,&local_48);
    if (!bVar6) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Invalid .ply file: File corrupted","");
      std::runtime_error::runtime_error(this,(string *)&local_68);
      *(undefined ***)this = &PTR__runtime_error_0080bf48;
      __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    __last._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_68,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (__last._M_current + -(ulong)*local_70),__last,&local_71);
    pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_68;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcStack_60;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_58[0];
    local_68 = (pointer *)0x0;
    pcStack_60 = (pointer)0x0;
    local_58[0] = (pointer)0x0;
    if ((pcVar2 != (pointer)0x0) &&
       (operator_delete(pcVar2,(long)pcVar3 - (long)pcVar2), local_68 != (pointer *)0x0)) {
      operator_delete(local_68,(long)local_58[0] - (long)local_68);
    }
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((vector<char,std::allocator<char>> *)buffer,
               (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    *local_70 = *(int *)&(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                (int)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    *pCur = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    bufferSize = local_70;
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      bufferSize = local_70;
    }
  }
  switch((ulong)eType) {
  case 0:
    pbVar8 = (byte *)*pCur;
    uVar10 = (uint)(char)*pbVar8;
    goto LAB_004bb4a1;
  case 1:
    pbVar8 = (byte *)*pCur;
    uVar10 = (uint)*pbVar8;
LAB_004bb4a1:
    *pCur = (char *)(pbVar8 + 1);
    break;
  case 2:
    uVar1 = *(ushort *)*pCur;
    *pCur = (char *)((long)*pCur + 2);
    uVar5 = uVar1 >> 8;
    if (!p_bBE) {
      uVar5 = uVar1;
      uVar1 = uVar1 >> 8;
    }
    uVar7 = (uint)(short)(uVar5 & 0xff | uVar1 << 8);
    goto LAB_004bb48e;
  case 3:
    uVar1 = *(ushort *)*pCur;
    *pCur = (char *)((long)*pCur + 2);
    uVar7 = (uint)(uVar1 >> 8);
    if (p_bBE) {
      uVar7 = (uint)uVar1;
    }
    uVar10 = (uint)(uVar1 >> 8);
    if (!p_bBE) {
      uVar10 = (uint)uVar1;
    }
    uVar7 = uVar10 & 0xff | (uVar7 & 0xff) << 8;
LAB_004bb48e:
    out->iUInt = uVar7;
    goto LAB_004bb4c1;
  case 4:
  case 5:
    uVar7 = *(uint *)*pCur;
    uVar14 = uVar7 >> 8;
    uVar12 = uVar7 >> 0x10;
    uVar9 = uVar7 >> 0x18;
    *pCur = (char *)((long)*pCur + 4);
    uVar10 = uVar14;
    if (p_bBE) {
      uVar13 = uVar7 & 0xff;
      uVar10 = uVar12;
      uVar7 = uVar9;
      uVar9 = uVar13;
      uVar12 = uVar14;
    }
    uVar10 = uVar7 & 0xff | (uVar10 & 0xff) << 8 | (uVar12 & 0xff) << 0x10 | uVar9 << 0x18;
    break;
  case 6:
    uVar7 = *(uint *)*pCur;
    *pCur = (char *)((long)*pCur + 4);
    uVar10 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    if (!p_bBE) {
      uVar10 = uVar7;
    }
    break;
  case 7:
    VVar4 = *(ValueUnion *)&((ValueUnion *)*pCur)->iUInt;
    *pCur = (char *)((ValueUnion *)*pCur + 1);
    VVar11 = (ValueUnion)
             ((ulong)VVar4 >> 0x38 | ((ulong)VVar4 & 0xff000000000000) >> 0x28 |
              ((ulong)VVar4 & 0xff0000000000) >> 0x18 | ((ulong)VVar4 & 0xff00000000) >> 8 |
              ((ulong)VVar4 & 0xff000000) << 8 | ((ulong)VVar4 & 0xff0000) << 0x18 |
              ((ulong)VVar4 & 0xff00) << 0x28 | (long)VVar4 << 0x38);
    if (!p_bBE) {
      VVar11 = VVar4;
    }
    *out = VVar11;
    goto LAB_004bb4c1;
  default:
    bVar6 = false;
    goto LAB_004bb4c3;
  }
  out->iUInt = uVar10;
LAB_004bb4c1:
  bVar6 = true;
LAB_004bb4c3:
  *bufferSize = *bufferSize - uVar15;
  return bVar6;
}

Assistant:

bool PLY::PropertyInstance::ParseValueBinary(IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  PLY::EDataType eType,
  PLY::PropertyInstance::ValueUnion* out,
  bool p_bBE)
{
  ai_assert(NULL != out);

  //calc element size
  unsigned int lsize = 0;
  switch (eType)
  {
  case EDT_Char:
  case EDT_UChar:
    lsize = 1;
    break;

  case EDT_UShort:
  case EDT_Short:
    lsize = 2;
    break;

  case EDT_UInt:
  case EDT_Int:
  case EDT_Float:
    lsize = 4;
    break;

  case EDT_Double:
    lsize = 8;
    break;

  case EDT_INVALID:
  default:
      break;
  }

  //read the next file block if needed
  if (bufferSize < lsize)
  {
    std::vector<char> nbuffer;
    if (streamBuffer.getNextBlock(nbuffer))
    {
      //concat buffer contents
      buffer = std::vector<char>(buffer.end() - bufferSize, buffer.end());
      buffer.insert(buffer.end(), nbuffer.begin(), nbuffer.end());
      nbuffer.clear();
      bufferSize = static_cast<unsigned int>(buffer.size());
      pCur = (char*)&buffer[0];
    }
    else
    {
      throw DeadlyImportError("Invalid .ply file: File corrupted");
    }
  }

  bool ret = true;
  switch (eType)
  {
  case EDT_UInt:
  {
    uint32_t t;
    memcpy(&t, pCur, sizeof(uint32_t));
    pCur += sizeof(uint32_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iUInt = t;
    break;
  }

  case EDT_UShort:
  {
    uint16_t t;
    memcpy(&t, pCur, sizeof(uint16_t));
    pCur += sizeof(uint16_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iUInt = t;
    break;
  }

  case EDT_UChar:
  {
    uint8_t t;
    memcpy(&t, pCur, sizeof(uint8_t));
    pCur += sizeof(uint8_t);
    out->iUInt = t;
    break;
  }

  case EDT_Int:
  {
    int32_t t;
    memcpy(&t, pCur, sizeof(int32_t));
    pCur += sizeof(int32_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iInt = t;
    break;
  }

  case EDT_Short:
  {
    int16_t t;
    memcpy(&t, pCur, sizeof(int16_t));
    pCur += sizeof(int16_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iInt = t;
    break;
  }

  case EDT_Char:
  {
    int8_t t;
    memcpy(&t, pCur, sizeof(int8_t));
    pCur += sizeof(int8_t);
    out->iInt = t;
    break;
  }

  case EDT_Float:
  {
    float t;
    memcpy(&t, pCur, sizeof(float));
    pCur += sizeof(float);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->fFloat = t;
    break;
  }
  case EDT_Double:
  {
    double t;
    memcpy(&t, pCur, sizeof(double));
    pCur += sizeof(double);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->fDouble = t;
    break;
  }
  default:
    ret = false;
  }

  bufferSize -= lsize;

  return ret;
}